

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O3

void ngram_fwdtree_start(ngram_search_t *ngs)

{
  int iVar1;
  last_ltrans_t *plVar2;
  chan_t *h;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  iVar1 = (ngs->base).n_words;
  lVar5 = (long)iVar1;
  (ngs->st).n_phone_eval = 0;
  (ngs->st).n_root_chan_eval = 0;
  (ngs->st).n_nonroot_chan_eval = 0;
  (ngs->st).n_last_chan_eval = 0;
  (ngs->st).n_word_lastchan_eval = 0;
  (ngs->st).n_lastphn_cand_utt = 0;
  (ngs->st).n_fwdflat_chan = 0;
  (ngs->st).n_fwdflat_words = 0;
  (ngs->st).n_fwdflat_word_transition = 0;
  (ngs->st).n_senone_active_utt = 0;
  ptmr_reset(&ngs->fwdtree_perf);
  ptmr_start(&ngs->fwdtree_perf);
  lVar4 = 0;
  ngs->bpidx = 0;
  ngs->bss_head = 0;
  if (lVar5 < 1) {
    ngs->n_active_chan[0] = 0;
    ngs->n_active_chan[1] = 0;
    ngs->n_active_word[0] = 0;
    ngs->n_active_word[1] = 0;
    ngs->best_score = 0;
    ngs->renormalized = 0;
  }
  else {
    memset(ngs->word_lat_idx,0xff,lVar5 * 4);
    ngs->n_active_chan[0] = 0;
    ngs->n_active_chan[1] = 0;
    ngs->n_active_word[0] = 0;
    ngs->n_active_word[1] = 0;
    ngs->best_score = 0;
    ngs->renormalized = 0;
    auVar3 = _DAT_00152bb0;
    plVar2 = ngs->last_ltrans;
    lVar5 = lVar5 + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6 = auVar6 ^ _DAT_00152bb0;
    auVar8 = _DAT_00153ac0;
    auVar9 = _DAT_00152ba0;
    do {
      auVar10 = auVar9 ^ auVar3;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        *(undefined4 *)((long)&plVar2->sf + lVar4) = 0xffffffff;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)&plVar2[1].sf + lVar4) = 0xffffffff;
      }
      auVar10 = auVar8 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)((long)&plVar2[2].sf + lVar4) = 0xffffffff;
        *(undefined4 *)((long)&plVar2[3].sf + lVar4) = 0xffffffff;
      }
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar5 + 4;
      lVar5 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar5 + 4;
      lVar4 = lVar4 + 0x30;
    } while ((ulong)(iVar1 + 3U >> 2) * 0x30 != lVar4);
  }
  ngs->n_frame = 0;
  ckd_free((ngs->base).hyp_str);
  (ngs->base).hyp_str = (char *)0x0;
  if (0 < ngs->n_1ph_words) {
    lVar4 = 0;
    do {
      hmm_clear(&ngs->word_chan[ngs->single_phone_wid[lVar4]]->hmm);
      lVar4 = lVar4 + 1;
    } while (lVar4 < ngs->n_1ph_words);
  }
  h = ngs->word_chan[((ngs->base).dict)->startwid];
  hmm_clear(&h->hmm);
  hmm_enter(&h->hmm,0,-1,0);
  return;
}

Assistant:

void
ngram_fwdtree_start(ngram_search_t *ngs)
{
    ps_search_t *base = (ps_search_t *)ngs;
    int32 i, w, n_words;
    root_chan_t *rhmm;

    n_words = ps_search_n_words(ngs);

    /* Reset utterance statistics. */
    memset(&ngs->st, 0, sizeof(ngs->st));
    ptmr_reset(&ngs->fwdtree_perf);
    ptmr_start(&ngs->fwdtree_perf);

    /* Reset backpointer table. */
    ngs->bpidx = 0;
    ngs->bss_head = 0;

    /* Reset word lattice. */
    for (i = 0; i < n_words; ++i)
        ngs->word_lat_idx[i] = NO_BP;

    /* Reset active HMM and word lists. */
    ngs->n_active_chan[0] = ngs->n_active_chan[1] = 0;
    ngs->n_active_word[0] = ngs->n_active_word[1] = 0;

    /* Reset scores. */
    ngs->best_score = 0;
    ngs->renormalized = 0;

    /* Reset other stuff. */
    for (i = 0; i < n_words; i++)
        ngs->last_ltrans[i].sf = -1;
    ngs->n_frame = 0;

    /* Clear the hypothesis string. */
    ckd_free(base->hyp_str);
    base->hyp_str = NULL;

    /* Reset the permanently allocated single-phone words, since they
     * may have junk left over in them from FWDFLAT. */
    for (i = 0; i < ngs->n_1ph_words; i++) {
        w = ngs->single_phone_wid[i];
        rhmm = (root_chan_t *) ngs->word_chan[w];
        hmm_clear(&rhmm->hmm);
    }

    /* Start search with <s>; word_chan[<s>] is permanently allocated */
    rhmm = (root_chan_t *) ngs->word_chan[dict_startwid(ps_search_dict(ngs))];
    hmm_clear(&rhmm->hmm);
    hmm_enter(&rhmm->hmm, 0, NO_BP, 0);
}